

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_int PDHG_Clear(CUPDLPwork *w)

{
  CUPDLPsettings *__ptr;
  CUPDLPresobj *resobj;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *__ptr_00;
  CUPDLPtimers *__ptr_01;
  
  __ptr = w->settings;
  resobj = w->resobj;
  iterates = w->iterates;
  __ptr_00 = w->stepsize;
  __ptr_01 = w->timers;
  time((time_t *)0x0);
  if (w->colScale != (cupdlp_float *)0x0) {
    free(w->colScale);
    w->colScale = (cupdlp_float *)0x0;
  }
  if (w->rowScale != (cupdlp_float *)0x0) {
    free(w->rowScale);
    w->rowScale = (cupdlp_float *)0x0;
  }
  if (w->buffer != (CUPDLPvec *)0x0) {
    vec_clear(w->buffer);
  }
  if (w->buffer2 != (cupdlp_float *)0x0) {
    free(w->buffer2);
  }
  if (w->buffer3 != (cupdlp_float *)0x0) {
    free(w->buffer3);
  }
  if (iterates != (CUPDLPiterates *)0x0) {
    iterates_clear(iterates);
  }
  if (resobj != (CUPDLPresobj *)0x0) {
    resobj_clear(resobj);
  }
  if (__ptr != (CUPDLPsettings *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (CUPDLPstepsize *)0x0) {
    free(__ptr_00);
  }
  if (__ptr_01 != (CUPDLPtimers *)0x0) {
    free(__ptr_01);
  }
  free(w);
  return 0;
}

Assistant:

cupdlp_int PDHG_Clear(CUPDLPwork *w) {
  CUPDLPproblem *problem = w->problem;
  CUPDLPsettings *settings = w->settings;
  CUPDLPiterates *iterates = w->iterates;
  CUPDLPresobj *resobj = w->resobj;
  CUPDLPstepsize *stepsize = w->stepsize;
  CUPDLPtimers *timers = w->timers;
  CUPDLPscaling *scaling = w->scaling;


  cupdlp_float begin = getTimeStamp();
#ifndef CUPDLP_CPU

  // CUDAmv *MV = w->MV;
  // if (MV)
  // {
  //     cupdlp_float begin = getTimeStamp();
  //     cuda_free_mv(MV);
  //     timers->FreeDeviceMemTime += getTimeStamp() - begin;
  // }
  CHECK_CUBLAS(cublasDestroy(w->cublashandle))
  CHECK_CUSPARSE(cusparseDestroy(w->cusparsehandle))
  CHECK_CUDA(cudaFree(w->dBuffer_csc_ATy))
  CHECK_CUDA(cudaFree(w->dBuffer_csr_Ax))
  if (w->buffer2) CUPDLP_FREE_VEC(w->buffer2);
  if (w->buffer3) CUPDLP_FREE_VEC(w->buffer3);
#endif
  if (w->colScale) CUPDLP_FREE_VEC(w->colScale);
  if (w->rowScale) CUPDLP_FREE_VEC(w->rowScale);

  if (w->buffer) {
    // CUPDLP_FREE_VEC(w->buffer);
    vec_clear(w->buffer);
  }

  if (w->buffer2 != NULL) {
    // CUPDLP_FREE_VEC(w->buffer);
    free(w->buffer2);
  }

  if (w->buffer3) {
    // CUPDLP_FREE_VEC(w->buffer);
    free(w->buffer3);
  }

  if (problem) {
    // problem_clear(problem);
    problem = cupdlp_NULL;
  }

  if (iterates) {
    iterates_clear(iterates);
  }

  if (resobj) {
    resobj_clear(resobj);
  }

#ifndef CUPDLP_CPU
  timers->FreeDeviceMemTime += getTimeStamp() - begin;
#endif

  if (settings) {
    settings_clear(settings);
  }
  if (stepsize) {
    stepsize_clear(stepsize);
  }
  if (timers) {
  timers_clear(w->settings->nLogLevel, timers);
  }
  if (scaling) {
    // scaling_clear(scaling);
    // if (scaling->colScale) {
    //    cupdlp_free(scaling->colScale);
    // }
    // if (scaling->rowScale) {
    //    cupdlp_free(scaling->rowScale);
    // }
    // cupdlp_free(scaling);
    scaling = cupdlp_NULL;
  }
  cupdlp_free(w);

  return 0;
}